

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

bool __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsFreeOrDecommitted
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address,
          uint pageCount)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint index;
  undefined4 *puVar4;
  bool local_29;
  uint base;
  uint pageCount_local;
  void *address_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  bVar2 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsInSegment
                    (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>,address);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.h"
                       ,0x14b,"(this->IsInSegment(address))","this->IsInSegment(address)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  index = GetBitRangeBase(this,address);
  BVar3 = TestRangeInDecommitPagesBitVector(this,index,pageCount);
  local_29 = true;
  if (BVar3 == '\0') {
    BVar3 = TestRangeInFreePagesBitVector(this,index,pageCount);
    local_29 = BVar3 != '\0';
  }
  return local_29;
}

Assistant:

bool IsFreeOrDecommitted(void* address, uint pageCount) const
    {
        Assert(this->IsInSegment(address));

        uint base = GetBitRangeBase(address);
        return this->TestRangeInDecommitPagesBitVector(base, pageCount) || this->TestRangeInFreePagesBitVector(base, pageCount);
    }